

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySubImage3D::testCopyTexSubImage3D
          (TextureCubeMapArraySubImage3D *this,GLuint width,GLuint height,GLuint depth,
          SubImage3DCopyParams *copy_params,GLboolean *test_passed)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  bool bVar2;
  MessageBuilder *pMVar3;
  undefined1 local_1b0 [384];
  
  clearCubeMapArrayTexture(this,width,height,depth,0);
  copyTexSubImage3D(this,copy_params);
  bVar2 = checkResults(this,width,height,depth);
  if (!bVar2) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "glCopyTexSubImage3D failed to copy data to texture cube map array\'s data store\n"
                   );
    std::operator<<((ostream *)this_00,"Texture Cube Map Array Dimensions (width, height, depth) ");
    std::operator<<((ostream *)this_00,"(");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00,",");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00,",");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00,")\n");
    std::operator<<((ostream *)this_00,"Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) "
                   );
    std::operator<<((ostream *)this_00,"(");
    pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&copy_params->m_xoffset);
    std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,",");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&copy_params->m_yoffset);
    std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,",");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&copy_params->m_zoffset);
    poVar1 = &pMVar3->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,")\n");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    "Texture Cube Map Array Copy Size (width, height, depth) ");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"(");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&copy_params->m_width);
    std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,",");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&copy_params->m_height);
    std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,",");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&copy_params->m_depth);
    std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")\n");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    *test_passed = '\0';
  }
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::testCopyTexSubImage3D(glw::GLuint width, glw::GLuint height, glw::GLuint depth,
														  const SubImage3DCopyParams& copy_params,
														  glw::GLboolean&			  test_passed)
{
	clearCubeMapArrayTexture(width, height, depth, 0);

	copyTexSubImage3D(copy_params);

	if (!checkResults(width, height, depth))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glCopyTexSubImage3D failed to copy data to texture cube map array's data store\n"
						   << "Texture Cube Map Array Dimensions (width, height, depth) "
						   << "(" << width << "," << height << "," << depth << ")\n"
						   << "Texture Cube Map Array Offsets (xoffset, yoffset, zoffset) "
						   << "(" << copy_params.m_xoffset << "," << copy_params.m_yoffset << ","
						   << copy_params.m_zoffset << ")\n"
						   << "Texture Cube Map Array Copy Size (width, height, depth) "
						   << "(" << copy_params.m_width << "," << copy_params.m_height << "," << copy_params.m_depth
						   << ")\n"
						   << tcu::TestLog::EndMessage;

		test_passed = false;
	}
}